

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelativeWorldCoordinates.h
# Opt level: O0

RelativeWorldCoordinates * __thiscall
KDIS::DATA_TYPE::RelativeWorldCoordinates::operator=
          (RelativeWorldCoordinates *this,RelativeWorldCoordinates *param_1)

{
  KFIXED<short,_(unsigned_char)__x03_> local_88;
  KFIXED<short,_(unsigned_char)__x03_> local_78;
  KFIXED<short,_(unsigned_char)__x03_> local_68;
  KFIXED<short,_(unsigned_char)__x03_> local_58 [2];
  KFIXED<short,_(unsigned_char)__x03_> local_38;
  KFIXED<short,_(unsigned_char)__x03_> local_28;
  RelativeWorldCoordinates *local_18;
  RelativeWorldCoordinates *param_1_local;
  RelativeWorldCoordinates *this_local;
  
  local_18 = param_1;
  param_1_local = this;
  DataTypeBase::operator=(&this->super_DataTypeBase,&param_1->super_DataTypeBase);
  this->m_ui16RefPnt = local_18->m_ui16RefPnt;
  KFIXED<short,_(unsigned_char)'\x03'>::KFIXED(&local_38,&local_18->m_DelX);
  KFIXED<short,_(unsigned_char)'\x03'>::operator=(&local_28,&this->m_DelX);
  KFIXED<short,_(unsigned_char)'\x03'>::~KFIXED(&local_28);
  KFIXED<short,_(unsigned_char)'\x03'>::~KFIXED(&local_38);
  KFIXED<short,_(unsigned_char)'\x03'>::KFIXED(&local_68,&local_18->m_DelY);
  KFIXED<short,_(unsigned_char)'\x03'>::operator=(local_58,&this->m_DelY);
  KFIXED<short,_(unsigned_char)'\x03'>::~KFIXED(local_58);
  KFIXED<short,_(unsigned_char)'\x03'>::~KFIXED(&local_68);
  KFIXED<short,_(unsigned_char)'\x03'>::KFIXED(&local_88,&local_18->m_DelZ);
  KFIXED<short,_(unsigned_char)'\x03'>::operator=(&local_78,&this->m_DelZ);
  KFIXED<short,_(unsigned_char)'\x03'>::~KFIXED(&local_78);
  KFIXED<short,_(unsigned_char)'\x03'>::~KFIXED(&local_88);
  return this;
}

Assistant:

class KDIS_EXPORT RelativeWorldCoordinates: public DataTypeBase
{
protected:

    KUINT16 m_ui16RefPnt;

    KFIXED16_3 m_DelX;

    KFIXED16_3 m_DelY;

    KFIXED16_3 m_DelZ;

public:

    static const KUINT16 RELATVE_WORLD_COORDINATES_SIZE = 8;

    RelativeWorldCoordinates();

    RelativeWorldCoordinates( KUINT16 RefPnt, KFIXED16_3 DelX, KFIXED16_3 DelY, KFIXED16_3 DelZ );

    RelativeWorldCoordinates(KDataStream &stream) noexcept(false);

    virtual ~RelativeWorldCoordinates();

    //************************************
    // FullName:    KDIS::DATA_TYPE::RelativeWorldCoordinates::SetReferencePoint
    //              KDIS::DATA_TYPE::RelativeWorldCoordinates::GetReferencePoint
    // Description: Identifies the number of the reference point against which
    //              e Delta-X, Delta-Y, and Delta-Z distances are calculated.
    // Parameter:   KUINT16 RP
    //************************************
    void SetReferencePoint( KUINT16 RP );
    KUINT16 GetReferencePoint() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::RelativeWorldCoordinates::SetDelta
    //              KDIS::DATA_TYPE::RelativeWorldCoordinates::GetDelta
    // Description: The difference between LE�s X, Y and Z direction coordinate and the
    //              X, Y and Z direction coordinate of the reference point.
    // Parameter:   KFIXED16_3
    //************************************
    void SetDeltaX( KFIXED16_3 X );
    KFIXED16_3 GetDeltaX() const;
    void SetDeltaY( KFIXED16_3 Y );
    KFIXED16_3 GetDeltaY() const;
    void SetDeltaZ( KFIXED16_3 X );
    KFIXED16_3 GetDeltaZ() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::RelativeWorldCoordinates::GetAsString
    // Description: Returns a string representation
    //************************************
    virtual KString GetAsString() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::RelativeWorldCoordinates::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual void Decode(KDataStream &stream) noexcept(false);

    //************************************
    // FullName:    KDIS::DATA_TYPE::RelativeWorldCoordinates::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual KDataStream Encode() const;
    virtual void Encode( KDataStream & stream ) const;

    KBOOL operator == ( const RelativeWorldCoordinates  & Value ) const;
    KBOOL operator != ( const RelativeWorldCoordinates  & Value ) const;
}